

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

char * fmt_bit_array(bit_array_t *bit_array)

{
  uint local_18;
  uint local_14;
  int i;
  int j;
  bit_array_t *bit_array_local;
  
  local_14 = 0;
  local_18 = (uint)bit_array->length;
  for (; local_18 = local_18 - 1, -1 < (int)local_18 && local_14 < 0xff; local_14 = local_14 + 1) {
    fmt_bit_array::str[(int)local_14] = bit_array->buffer[(int)local_18];
  }
  fmt_bit_array::str[(int)local_14] = '\0';
  return fmt_bit_array::str;
}

Assistant:

char * fmt_bit_array(const bit_array_t *bit_array) {
    static char str[MAX_BIT_STR] = {0};

    int j = 0;
    for(int i = bit_array->length-1; i>=0 && (j < sizeof(str)-2); i--) {
        str[j] = bit_array->buffer[i];
        j++;
    }

    str[j] = 0;
    return str;
}